

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

void Fraig_ManCreateSolver(Fraig_Man_t *p)

{
  Msat_Solver_t *pMVar1;
  Msat_IntVec_t *pMVar2;
  Msat_ClauseVec_t *pMVar3;
  Fraig_Man_t *p_local;
  
  if (p->pSat == (Msat_Solver_t *)0x0) {
    pMVar1 = Msat_SolverAlloc(500,1.0,1.0,1.0,1.0,0);
    p->pSat = pMVar1;
    pMVar2 = Msat_SolverReadConeVars(p->pSat);
    p->vVarsInt = pMVar2;
    pMVar3 = Msat_SolverReadAdjacents(p->pSat);
    p->vAdjacents = pMVar3;
    pMVar2 = Msat_SolverReadVarsUsed(p->pSat);
    p->vVarsUsed = pMVar2;
    timeSelect = 0;
    timeAssign = 0;
    return;
  }
  __assert_fail("p->pSat == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigMan.c"
                ,0x149,"void Fraig_ManCreateSolver(Fraig_Man_t *)");
}

Assistant:

void Fraig_ManCreateSolver( Fraig_Man_t * p )
{
    extern abctime timeSelect;
    extern abctime timeAssign;
    assert( p->pSat == NULL );
    // allocate data for SAT solving
    p->pSat       = Msat_SolverAlloc( 500, 1, 1, 1, 1, 0 );
    p->vVarsInt   = Msat_SolverReadConeVars( p->pSat );   
    p->vAdjacents = Msat_SolverReadAdjacents( p->pSat );
    p->vVarsUsed  = Msat_SolverReadVarsUsed( p->pSat );
    timeSelect = 0;
    timeAssign = 0;
}